

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O3

void quicly_cc_reno_on_lost
               (quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t lost_pn,uint64_t next_pn
               ,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  uint uVar2;
  
  if (cc->recovery_end <= lost_pn) {
    cc->recovery_end = next_pn;
    cc->num_loss_episodes = cc->num_loss_episodes + 1;
    if (cc->cwnd_exiting_slow_start == 0) {
      cc->cwnd_exiting_slow_start = cc->cwnd;
    }
    uVar2 = (uint)(long)((double)cc->cwnd * 0.7);
    uVar1 = max_udp_payload_size * 2;
    if (max_udp_payload_size * 2 <= uVar2) {
      uVar1 = uVar2;
    }
    cc->cwnd = uVar1;
    cc->ssthresh = uVar1;
    if (uVar1 < cc->cwnd_minimum) {
      cc->cwnd_minimum = uVar1;
    }
  }
  return;
}

Assistant:

void quicly_cc_reno_on_lost(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t lost_pn, uint64_t next_pn,
                            int64_t now, uint32_t max_udp_payload_size)
{
    /* Nothing to do if loss is in recovery window. */
    if (lost_pn < cc->recovery_end)
        return;
    cc->recovery_end = next_pn;

    ++cc->num_loss_episodes;
    if (cc->cwnd_exiting_slow_start == 0)
        cc->cwnd_exiting_slow_start = cc->cwnd;

    /* Reduce congestion window. */
    cc->cwnd *= QUICLY_RENO_BETA;
    if (cc->cwnd < QUICLY_MIN_CWND * max_udp_payload_size)
        cc->cwnd = QUICLY_MIN_CWND * max_udp_payload_size;
    cc->ssthresh = cc->cwnd;

    if (cc->cwnd_minimum > cc->cwnd)
        cc->cwnd_minimum = cc->cwnd;
}